

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O2

void avro::codec_traits<uau::_union_array_union_Union__1__>::decode
               (Decoder *d,_union_array_union_Union__1__ *v)

{
  ulong uVar1;
  Exception *this;
  allocator<char> local_39;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_> vv
  ;
  
  uVar1 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar1) {
    this = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vv,"Union index too big",&local_39);
    Exception::Exception(this,(string *)&vv);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar1 & 1) != 0) {
    vv.
    super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vv.
    super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vv.
    super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    codec_traits<std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
    ::decode(d,&vv);
    uau::_union_array_union_Union__1__::set_array(v,&vv);
    std::
    vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
    ::~vector(&vv);
    return;
  }
  (**(code **)(*(long *)d + 0x18))(d);
  uau::_union_array_union_Union__1__::set_null(v);
  return;
}

Assistant:

static void decode(Decoder& d, uau::_union_array_union_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            d.decodeNull();
            v.set_null();
            break;
        case 1:
            {
                std::vector<uau::_union_array_union_Union__0__ > vv;
                avro::decode(d, vv);
                v.set_array(vv);
            }
            break;
        }
    }